

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stack_relative
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructStackRelative);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void stack_relative(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// SO.
		target(CycleFetchPreviousPCThrowaway);	// IO.

		target(OperationConstructStackRelative);
		read_write(type, is8bit, target);
	}